

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O0

void __thiscall cubeb_async_logger::stop(cubeb_async_logger *this)

{
  bool bVar1;
  id this_00;
  __pointer_type prVar2;
  thread *in_RDI;
  ring_buffer_base<cubeb_log_message> *owned_queue;
  thread *in_stack_ffffffffffffffc8;
  memory_order __m;
  id in_stack_ffffffffffffffd8;
  __pointer_type __p;
  id in_stack_ffffffffffffffe0;
  id in_stack_ffffffffffffffe8;
  
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_RDI,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
  this_00 = std::thread::get_id(in_RDI + 3);
  std::thread::id::id((id *)&stack0xffffffffffffffe8);
  bVar1 = std::operator!=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (bVar1) {
    std::thread::join();
    memset(&stack0xffffffffffffffe0,0,8);
    std::thread::thread((thread *)0x10fa5f);
    std::thread::operator=(in_RDI,in_stack_ffffffffffffffc8);
    std::thread::~thread((thread *)0x10fa7c);
    prVar2 = std::atomic<ring_buffer_base<cubeb_log_message>_*>::load
                       ((atomic<ring_buffer_base<cubeb_log_message>_*> *)
                        in_stack_ffffffffffffffd8._M_thread,(memory_order)((ulong)in_RDI >> 0x20));
    do {
      bVar1 = std::atomic<ring_buffer_base<cubeb_log_message>_*>::compare_exchange_weak
                        ((atomic<ring_buffer_base<cubeb_log_message>_*> *)this_00._M_thread,
                         (__pointer_type *)in_stack_ffffffffffffffe8._M_thread,
                         (__pointer_type)in_stack_ffffffffffffffe0._M_thread,
                         (memory_order)((ulong)prVar2 >> 0x20));
      __m = (memory_order)((ulong)in_RDI >> 0x20);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
    __p = prVar2;
    if (prVar2 != (__pointer_type)0x0) {
      ring_buffer_base<cubeb_log_message>::~ring_buffer_base
                ((ring_buffer_base<cubeb_log_message> *)0x10faca);
      operator_delete(prVar2,0x18);
    }
    std::atomic<ring_buffer_base<cubeb_log_message>_*>::store
              ((atomic<ring_buffer_base<cubeb_log_message>_*> *)in_stack_ffffffffffffffe0._M_thread,
               __p,__m);
  }
  return;
}

Assistant:

void stop()
  {
    assert(((g_cubeb_log_callback == cubeb_noop_log_callback) ||
            !g_cubeb_log_callback) &&
           "Only call stop after logging has been disabled.");
    shutdown_thread = true;
    if (logging_thread.get_id() != std::thread::id()) {
      logging_thread.join();
      logging_thread = std::thread();
      auto * owned_queue = msg_queue.load();
      // Check if the queue is being used. If not, grab ownership. If yes,
      // try again shortly. At this point, the logging thread has been joined,
      // so nothing is going to dequeue.
      // If there is a valid pointer here, then the real-time audio thread that
      // logs won't attempt to write into the queue, and instead drop the
      // message.
      while (!msg_queue.compare_exchange_weak(owned_queue, nullptr)) {
      }
      delete owned_queue;
      msg_queue_consumer.store(nullptr);
    }
  }